

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_convolutiondepthwise_mul(NetOptimize *this)

{
  int iVar1;
  value_type pLVar2;
  value_type pLVar3;
  value_type pLVar4;
  FILE *__stream;
  bool bVar5;
  int iVar6;
  size_type sVar7;
  reference ppLVar8;
  reference pvVar9;
  size_type sVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  reference pvVar16;
  int iVar17;
  long in_RDI;
  int top_blob_index_final;
  int j_1;
  float *conv_weight_outch;
  int i_1;
  float *bias;
  float *weight;
  int weight_per_outch;
  int channels;
  MemoryData *memorydata;
  size_t k;
  BinaryOp *binaryop;
  ConvolutionDepthWise *convolutiondepthwise;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  int local_74;
  int local_64;
  size_type local_40;
  size_type local_28;
  size_type local_18;
  
  sVar7 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_18 = 0;
  do {
    if (sVar7 <= local_18) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_18);
    bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (!bVar5) {
      ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_18);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar8)->tops,0);
      iVar1 = *pvVar9;
      local_28 = local_18;
      do {
        do {
          do {
            local_28 = local_28 + 1;
            if (sVar7 <= local_28) goto LAB_00153e28;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_28);
            bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                                    ,(char *)CONCAT44(in_stack_ffffffffffffff5c,
                                                      in_stack_ffffffffffffff58));
          } while (bVar5);
          ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_28);
          sVar10 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar8)->bottoms);
        } while (sVar10 != 2);
        ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_28);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar8)->bottoms,0);
      } while (*pvVar9 != iVar1);
LAB_00153e28:
      if (local_28 != sVar7) {
        ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_18);
        pLVar2 = *ppLVar8;
        ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_28);
        pLVar3 = *ppLVar8;
        if ((*(int *)&pLVar3[1]._vptr_Layer == 2) &&
           (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 0)) {
          for (local_40 = 0; local_40 < local_28; local_40 = local_40 + 1) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_40);
            bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                                    ,(char *)CONCAT44(in_stack_ffffffffffffff5c,
                                                      in_stack_ffffffffffffff58));
            if (!bVar5) {
              ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                    (in_RDI + 0x58),local_40);
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar8)->tops,0);
              iVar1 = *pvVar9;
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->bottoms,1);
              if (iVar1 == *pvVar9) break;
            }
          }
          if (local_40 != local_28) {
            ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_40);
            __stream = _stderr;
            pLVar4 = *ppLVar8;
            iVar1 = *(int *)&pLVar2[1]._vptr_Layer;
            if (((*(int *)&pLVar4[1]._vptr_Layer == iVar1) &&
                (*(int *)((long)&pLVar4[1]._vptr_Layer + 4) == 0)) &&
               (iVar6._0_1_ = pLVar4[1].one_blob_only, iVar6._1_1_ = pLVar4[1].support_inplace,
               iVar6._2_1_ = pLVar4[1].support_vulkan, iVar6._3_1_ = pLVar4[1].support_packing,
               iVar6 == 0)) {
              uVar11 = std::__cxx11::string::c_str();
              uVar12 = std::__cxx11::string::c_str();
              fprintf(__stream,"fuse_convolutiondepthwise_mul %s %s\n",uVar11,uVar12);
              iVar6 = *(int *)&pLVar2[1].type.field_0x4 / iVar1;
              pfVar13 = ncnn::Mat::operator_cast_to_float_
                                  ((Mat *)&pLVar2[1].tops.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_end_of_storage);
              pfVar14 = ncnn::Mat::operator_cast_to_float_((Mat *)&pLVar2[2].support_tensor_storage)
              ;
              for (local_64 = 0; local_64 < iVar1; local_64 = local_64 + 1) {
                iVar17 = iVar6 * local_64;
                for (local_74 = 0; local_74 < iVar6; local_74 = local_74 + 1) {
                  pfVar15 = ncnn::Mat::operator[]
                                      ((Mat *)&pLVar4[1].support_tensor_storage,(long)local_64);
                  pfVar13[(long)iVar17 + (long)local_74] =
                       *pfVar15 * pfVar13[(long)iVar17 + (long)local_74];
                }
                if (pfVar14 != (float *)0x0) {
                  in_stack_ffffffffffffff64 = pfVar14[local_64];
                  pfVar15 = ncnn::Mat::operator[]
                                      ((Mat *)&pLVar4[1].support_tensor_storage,(long)local_64);
                  pfVar14[local_64] = in_stack_ffffffffffffff64 * *pfVar15;
                }
              }
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->tops,0);
              iVar1 = *pvVar9;
              in_stack_ffffffffffffff5c = iVar1;
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar2->tops,0);
              *pvVar9 = in_stack_ffffffffffffff5c;
              in_stack_ffffffffffffff60 = (int)local_18;
              pvVar16 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                  (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)
                                    (in_RDI + 0x50),(long)iVar1);
              pvVar16->producer = in_stack_ffffffffffffff60;
              std::__cxx11::string::operator=((string *)&pLVar3->type,"ncnnfused");
            }
          }
        }
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_convolutiondepthwise_mul()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // ConvolutionDepthWise - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse ConvolutionDepthWise - BinaryOp to ConvolutionDepthWise
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layers[i];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        if (binaryop->op_type != 2 || binaryop->with_scalar)
            continue;

        // MemoryData - ..... - BinaryOp
        size_t k = 0;
        for (; k < j; k++)
        {
            if (layers[k]->type != "MemoryData")
                continue;

            if (layers[k]->tops[0] == binaryop->bottoms[1])
                break;
        }

        if (k == j)
            continue;

        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[k];

        int channels = convolutiondepthwise->num_output;

        if (memorydata->w != channels || memorydata->h != 0 || memorydata->c != 0)
        {
            // not bias-like broadcasting type
            continue;
        }

        fprintf(stderr, "fuse_convolutiondepthwise_mul %s %s\n", convolutiondepthwise->name.c_str(), binaryop->name.c_str());

        {
            const int weight_per_outch = convolutiondepthwise->weight_data_size / channels;

            float* weight = convolutiondepthwise->weight_data;
            float* bias = convolutiondepthwise->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= memorydata->data[i];
                }

                if (bias)
                {
                    bias[i] = bias[i] * memorydata->data[i];
                }
            }
        }

        int top_blob_index_final = binaryop->tops[0];
        convolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        binaryop->type = "ncnnfused";
    }

    return 0;
}